

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_collective.cpp
# Opt level: O0

void __thiscall MxxColl_AllgathervGeneral_Test::TestBody(MxxColl_AllgathervGeneral_Test *this)

{
  pointer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  pointer __n;
  reference pvVar4;
  reference pvVar5;
  reference out;
  char *pcVar6;
  AssertHelper local_1f0;
  Message local_1e8;
  int local_1dc;
  undefined1 local_1d8 [8];
  AssertionResult gtest_ar_4;
  int j_2;
  int i_4;
  Message local_1b8;
  size_type local_1b0;
  undefined1 local_1a8 [8];
  AssertionResult gtest_ar_3;
  vector<int,_std::allocator<int>_> local_178;
  AssertHelper local_160;
  Message local_158;
  int local_14c;
  undefined1 local_148 [8];
  AssertionResult gtest_ar_2;
  int j_1;
  int i_3;
  Message local_128;
  size_type local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_e8;
  Message local_e0;
  int local_d4;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar;
  int j;
  int i_2;
  size_t pos;
  size_type sStack_a8;
  int i_1;
  size_t total_size;
  vector<int,_std::allocator<int>_> all;
  size_t i;
  undefined1 local_78 [8];
  vector<int,_std::allocator<int>_> els;
  size_t size;
  vector<unsigned_long,_std::allocator<unsigned_long>_> recv_sizes;
  comm c;
  MxxColl_AllgathervGeneral_Test *this_local;
  
  this_00 = &recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
  mxx::comm::comm((comm *)this_00);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size);
  iVar2 = mxx::comm::rank((comm *)this_00);
  __n = (pointer)(long)(iVar2 * 5 + 10);
  std::allocator<int>::allocator((allocator<int> *)((long)&i + 7));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_78,(size_type)__n,
             (allocator<int> *)((long)&i + 7));
  std::allocator<int>::~allocator((allocator<int> *)((long)&i + 7));
  for (all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage = (pointer)0x0;
      all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage < __n;
      all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage =
           (pointer)((long)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage + 1)) {
    iVar3 = mxx::comm::rank((comm *)&recv_sizes.
                                     super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
    iVar2 = (int)all.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage;
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_78,
                        (size_type)
                        all.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    *pvVar4 = iVar3 * 0xd + iVar2 * -0x2a;
  }
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&total_size);
  sStack_a8 = 0;
  iVar2 = mxx::comm::size((comm *)&recv_sizes.
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,(long)iVar2);
  for (pos._4_4_ = 0;
      iVar2 = mxx::comm::size((comm *)&recv_sizes.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage),
      pos._4_4_ < iVar2; pos._4_4_ = pos._4_4_ + 1) {
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,
                        (long)pos._4_4_);
    *pvVar5 = (long)((pos._4_4_ + 2) * 5);
    pvVar5 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator[]
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,
                        (long)pos._4_4_);
    sStack_a8 = *pvVar5 + sStack_a8;
  }
  std::vector<int,_std::allocator<int>_>::resize
            ((vector<int,_std::allocator<int>_> *)&total_size,sStack_a8);
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_78,0);
  out = std::vector<int,_std::allocator<int>_>::operator[]
                  ((vector<int,_std::allocator<int>_> *)&total_size,0);
  mxx::allgatherv<int>
            (pvVar4,(size_t)__n,out,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,
             (comm *)&recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  _j = 0;
  for (gtest_ar.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar.message_.ptr_._4_4_,
      iVar3 = mxx::comm::size((comm *)&recv_sizes.
                                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage),
      iVar2 < iVar3; gtest_ar.message_.ptr_._4_4_ = gtest_ar.message_.ptr_._4_4_ + 1) {
    for (gtest_ar.message_.ptr_._0_4_ = 0;
        SBORROW4((int)gtest_ar.message_.ptr_,(gtest_ar.message_.ptr_._4_4_ + 2) * 5) !=
        (int)gtest_ar.message_.ptr_ + (gtest_ar.message_.ptr_._4_4_ + 2) * -5 < 0;
        gtest_ar.message_.ptr_._0_4_ = (int)gtest_ar.message_.ptr_ + 1) {
      local_d4 = gtest_ar.message_.ptr_._4_4_ * 0xd + (int)gtest_ar.message_.ptr_ * -0x2a;
      pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)&total_size,_j);
      testing::internal::EqHelper<false>::Compare<int,int>
                ((EqHelper<false> *)local_d0,"i*13 - 42*j","all[pos++]",&local_d4,pvVar4);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
      if (!bVar1) {
        testing::Message::Message(&local_e0);
        pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_d0);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e8,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                   ,0x1e5,pcVar6);
        testing::internal::AssertHelper::operator=(&local_e8,&local_e0);
        testing::internal::AssertHelper::~AssertHelper(&local_e8);
        testing::Message::~Message(&local_e0);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
      if (!bVar1) goto LAB_00169bc1;
      _j = _j + 1;
    }
  }
  pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)local_78,0);
  mxx::allgatherv<int>
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_,pvVar4,(size_t)__n,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,
             (comm *)&recv_sizes.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::operator=
            ((vector<int,_std::allocator<int>_> *)&total_size,
             (vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&gtest_ar_1.message_);
  local_120 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)&total_size);
  testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
            ((EqHelper<false> *)local_118,"total_size","all.size()",&stack0xffffffffffffff58,
             &local_120);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&j_1,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
               ,0x1ea,pcVar6);
    testing::internal::AssertHelper::operator=((AssertHelper *)&j_1,&local_128);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j_1);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  if (bVar1) {
    _j = 0;
    for (gtest_ar_2.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar_2.message_.ptr_._4_4_,
        iVar3 = mxx::comm::size((comm *)&recv_sizes.
                                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                         ._M_impl.super__Vector_impl_data._M_end_of_storage),
        iVar2 < iVar3; gtest_ar_2.message_.ptr_._4_4_ = gtest_ar_2.message_.ptr_._4_4_ + 1) {
      for (gtest_ar_2.message_.ptr_._0_4_ = 0;
          SBORROW4((int)gtest_ar_2.message_.ptr_,(gtest_ar_2.message_.ptr_._4_4_ + 2) * 5) !=
          (int)gtest_ar_2.message_.ptr_ + (gtest_ar_2.message_.ptr_._4_4_ + 2) * -5 < 0;
          gtest_ar_2.message_.ptr_._0_4_ = (int)gtest_ar_2.message_.ptr_ + 1) {
        local_14c = gtest_ar_2.message_.ptr_._4_4_ * 0xd + (int)gtest_ar_2.message_.ptr_ * -0x2a;
        pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)&total_size,_j);
        testing::internal::EqHelper<false>::Compare<int,int>
                  ((EqHelper<false> *)local_148,"i*13 - 42*j","all[pos++]",&local_14c,pvVar4);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_148);
        if (!bVar1) {
          testing::Message::Message(&local_158);
          pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_148);
          testing::internal::AssertHelper::AssertHelper
                    (&local_160,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                     ,0x1ee,pcVar6);
          testing::internal::AssertHelper::operator=(&local_160,&local_158);
          testing::internal::AssertHelper::~AssertHelper(&local_160);
          testing::Message::~Message(&local_158);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_148);
        if (!bVar1) goto LAB_00169bc1;
        _j = _j + 1;
      }
    }
    mxx::comm::comm((comm *)&gtest_ar_3.message_);
    mxx::allgatherv<int>
              (&local_178,(vector<int,_std::allocator<int>_> *)local_78,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size,
               (comm *)&gtest_ar_3.message_);
    std::vector<int,_std::allocator<int>_>::operator=
              ((vector<int,_std::allocator<int>_> *)&total_size,&local_178);
    std::vector<int,_std::allocator<int>_>::~vector(&local_178);
    mxx::comm::~comm((comm *)&gtest_ar_3.message_);
    local_1b0 = std::vector<int,_std::allocator<int>_>::size
                          ((vector<int,_std::allocator<int>_> *)&total_size);
    testing::internal::EqHelper<false>::Compare<unsigned_long,unsigned_long>
              ((EqHelper<false> *)local_1a8,"total_size","all.size()",&stack0xffffffffffffff58,
               &local_1b0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a8);
    if (!bVar1) {
      testing::Message::Message(&local_1b8);
      pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1a8);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&j_2,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                 ,499,pcVar6);
      testing::internal::AssertHelper::operator=((AssertHelper *)&j_2,&local_1b8);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&j_2);
      testing::Message::~Message(&local_1b8);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a8);
    if (bVar1) {
      _j = 0;
      for (gtest_ar_4.message_.ptr_._4_4_ = 0; iVar2 = gtest_ar_4.message_.ptr_._4_4_,
          iVar3 = mxx::comm::size((comm *)&recv_sizes.
                                           super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                           ._M_impl.super__Vector_impl_data._M_end_of_storage),
          iVar2 < iVar3; gtest_ar_4.message_.ptr_._4_4_ = gtest_ar_4.message_.ptr_._4_4_ + 1) {
        for (gtest_ar_4.message_.ptr_._0_4_ = 0;
            SBORROW4((int)gtest_ar_4.message_.ptr_,(gtest_ar_4.message_.ptr_._4_4_ + 2) * 5) !=
            (int)gtest_ar_4.message_.ptr_ + (gtest_ar_4.message_.ptr_._4_4_ + 2) * -5 < 0;
            gtest_ar_4.message_.ptr_._0_4_ = (int)gtest_ar_4.message_.ptr_ + 1) {
          local_1dc = gtest_ar_4.message_.ptr_._4_4_ * 0xd + (int)gtest_ar_4.message_.ptr_ * -0x2a;
          pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)&total_size,_j);
          testing::internal::EqHelper<false>::Compare<int,int>
                    ((EqHelper<false> *)local_1d8,"i*13 - 42*j","all[pos++]",&local_1dc,pvVar4);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d8);
          if (!bVar1) {
            testing::Message::Message(&local_1e8);
            pcVar6 = testing::AssertionResult::failure_message((AssertionResult *)local_1d8);
            testing::internal::AssertHelper::AssertHelper
                      (&local_1f0,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/ParBLiSS[P]psac/ext/mxx/test/test_collective.cpp"
                       ,0x1f7,pcVar6);
            testing::internal::AssertHelper::operator=(&local_1f0,&local_1e8);
            testing::internal::AssertHelper::~AssertHelper(&local_1f0);
            testing::Message::~Message(&local_1e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d8);
          if (!bVar1) goto LAB_00169bc1;
          _j = _j + 1;
        }
      }
    }
  }
LAB_00169bc1:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&total_size);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_78);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::~vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&size);
  mxx::comm::~comm((comm *)&recv_sizes.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage);
  return;
}

Assistant:

TEST(MxxColl, AllgathervGeneral) {
    mxx::comm c;
    std::vector<size_t> recv_sizes;
    // fill elements
    size_t size = 5*(c.rank()+2);
    std::vector<int> els(size);
    for (size_t i = 0; i < size; ++i) {
        els[i] = c.rank()*13 - 42*i;
    }
    // prepare recv sizes and output vector
    std::vector<int> all;
    size_t total_size = 0;
    recv_sizes.resize(c.size());
    for (int i = 0; i < c.size(); ++i) {
        recv_sizes[i] = 5*(i+2);
        total_size += recv_sizes[i];
    }
    all.resize(total_size);

    // general gatherv
    mxx::allgatherv(&els[0], size, &all[0], recv_sizes, c);
    size_t pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
    // convenience functions
    all = mxx::allgatherv(&els[0], size, recv_sizes, c);
    ASSERT_EQ(total_size, all.size());
    pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
    // convenience functions
    all = mxx::allgatherv(els, recv_sizes);
    ASSERT_EQ(total_size, all.size());
    pos = 0;
    for (int i = 0; i < c.size(); ++i) {
        for (int j = 0; j < (5*(i+2)); ++j) {
            ASSERT_EQ(i*13 - 42*j, all[pos++]);
        }
    }
}